

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_api.cpp
# Opt level: O2

void __thiscall cppcms::impl::cgi::http::async_read_eof(http *this,callback *h)

{
  element_type *peVar1;
  ignore_binder local_80;
  callback<void_(const_std::error_code_&,_unsigned_long)> local_78;
  ignore_binder cb;
  __weak_ptr<cppcms::impl::cgi::http,(__gnu_cxx::_Lock_policy)2> local_68 [8];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_60;
  undefined1 local_58 [48];
  
  peVar1 = (this->watchdog_).
           super___shared_ptr<cppcms::impl::cgi::http_watchdog,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  self((http *)local_58);
  std::__weak_ptr<cppcms::impl::cgi::http,(__gnu_cxx::_Lock_policy)2>::
  __weak_ptr<cppcms::impl::cgi::http,void>
            (local_68,(__shared_ptr<cppcms::impl::cgi::http,_(__gnu_cxx::_Lock_policy)2> *)local_58)
  ;
  std::
  _Rb_tree<std::weak_ptr<cppcms::impl::cgi::http>,std::weak_ptr<cppcms::impl::cgi::http>,std::_Identity<std::weak_ptr<cppcms::impl::cgi::http>>,std::owner_less<std::weak_ptr<cppcms::impl::cgi::http>>,std::allocator<std::weak_ptr<cppcms::impl::cgi::http>>>
  ::_M_insert_unique<std::weak_ptr<cppcms::impl::cgi::http>const&>
            ((_Rb_tree<std::weak_ptr<cppcms::impl::cgi::http>,std::weak_ptr<cppcms::impl::cgi::http>,std::_Identity<std::weak_ptr<cppcms::impl::cgi::http>>,std::owner_less<std::weak_ptr<cppcms::impl::cgi::http>>,std::allocator<std::weak_ptr<cppcms::impl::cgi::http>>>
              *)&peVar1->connections_,(weak_ptr<cppcms::impl::cgi::http> *)local_68);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_60);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8));
  booster::intrusive_ptr<booster::callable<void_()>_>::intrusive_ptr
            ((intrusive_ptr<booster::callable<void_()>_> *)&cb,&h->call_ptr);
  booster::aio::buffer((mutable_buffer *)local_58,&async_read_eof::a,1);
  booster::intrusive_ptr<booster::callable<void_()>_>::intrusive_ptr
            ((intrusive_ptr<booster::callable<void_()>_> *)&local_80,
             (intrusive_ptr<booster::callable<void_()>_> *)&cb);
  booster::callback<void_(const_std::error_code_&,_unsigned_long)>::
  callback<cppcms::impl::cgi::http::ignore_binder>(&local_78,&local_80);
  booster::aio::stream_socket::async_read_some
            ((mutable_buffer *)&this->socket_,(callback *)local_58);
  booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_>::
  ~intrusive_ptr(&local_78.call_ptr);
  booster::intrusive_ptr<booster::callable<void_()>_>::~intrusive_ptr
            ((intrusive_ptr<booster::callable<void_()>_> *)&local_80);
  std::
  _Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
  ::~_Vector_base((_Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
                   *)(local_58 + 0x18));
  booster::intrusive_ptr<booster::callable<void_()>_>::~intrusive_ptr
            ((intrusive_ptr<booster::callable<void_()>_> *)&cb);
  return;
}

Assistant:

virtual void async_read_eof(callback const &h)
		{
			watchdog_->add(self());
			static char a;
			ignore_binder cb = { h };
			socket_.async_read_some(io::buffer(&a,1),cb);
		}